

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O2

spv_result_t spvtools::anon_unknown_6::advance(spv_text text,spv_position position)

{
  size_t *psVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  spv_position psVar6;
  
  uVar3 = text->length;
  uVar5 = position->index;
  psVar1 = &position->column;
  do {
    if (uVar3 <= uVar5) {
      return SPV_END_OF_STREAM;
    }
    pcVar4 = text->str;
    cVar2 = pcVar4[uVar5];
    psVar6 = (spv_position)psVar1;
    if (cVar2 != '\t') {
      if (cVar2 != '\n') {
        if ((cVar2 == '\r') || (cVar2 == ' ')) goto LAB_005183d1;
        if (cVar2 != ';') {
          if (cVar2 == '\0') {
            return SPV_END_OF_STREAM;
          }
          return SPV_SUCCESS;
        }
        while( true ) {
          if (uVar3 <= uVar5) {
            return SPV_END_OF_STREAM;
          }
          cVar2 = pcVar4[uVar5];
          if (cVar2 == '\0') {
            return SPV_END_OF_STREAM;
          }
          if (cVar2 == '\n') break;
          position->column = position->column + 1;
          uVar5 = uVar5 + 1;
          position->index = uVar5;
        }
      }
      *psVar1 = 0;
      psVar6 = position;
    }
LAB_005183d1:
    psVar6->line = psVar6->line + 1;
    uVar5 = uVar5 + 1;
    position->index = uVar5;
  } while( true );
}

Assistant:

spv_result_t advance(spv_text text, spv_position position) {
  // NOTE: Consume white space, otherwise don't advance.
  while (true) {
    if (position->index >= text->length) return SPV_END_OF_STREAM;
    switch (text->str[position->index]) {
      case '\0':
        return SPV_END_OF_STREAM;
      case ';':
        if (spv_result_t error = advanceLine(text, position)) return error;
        continue;
      case ' ':
      case '\t':
      case '\r':
        position->column++;
        position->index++;
        continue;
      case '\n':
        position->column = 0;
        position->line++;
        position->index++;
        continue;
      default:
        return SPV_SUCCESS;
    }
  }
}